

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::visitRefAs(BinaryInstWriter *this,RefAs *curr)

{
  RefAsOp RVar1;
  BufferWithRandomAccess *this_00;
  U32LEB UStack_10;
  
  RVar1 = curr->op;
  if (RVar1 == ExternConvertAny) {
    this_00 = BufferWithRandomAccess::operator<<(this->o,-5);
    UStack_10.value = 0x1b;
  }
  else {
    if (RVar1 != AnyConvertExtern) {
      if (RVar1 == RefAsNonNull) {
        BufferWithRandomAccess::operator<<(this->o,-0x2c);
        return;
      }
      handle_unreachable("invalid ref.as_*",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                         ,0x9e1);
    }
    this_00 = BufferWithRandomAccess::operator<<(this->o,-5);
    UStack_10.value = 0x1a;
  }
  BufferWithRandomAccess::operator<<(this_00,UStack_10);
  return;
}

Assistant:

void BinaryInstWriter::visitRefAs(RefAs* curr) {
  switch (curr->op) {
    case RefAsNonNull:
      o << int8_t(BinaryConsts::RefAsNonNull);
      break;
    case AnyConvertExtern:
      o << int8_t(BinaryConsts::GCPrefix)
        << U32LEB(BinaryConsts::AnyConvertExtern);
      break;
    case ExternConvertAny:
      o << int8_t(BinaryConsts::GCPrefix)
        << U32LEB(BinaryConsts::ExternConvertAny);
      break;
    default:
      WASM_UNREACHABLE("invalid ref.as_*");
  }
}